

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::doAddCol
          (SPxLPBase<double> *this,double *objValue,double *lowerValue,SVectorBase<double> *colVec,
          double *upperValue,bool scale)

{
  Item *pIVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  Item *pIVar5;
  Nonzero<double> *pNVar6;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  int local_88;
  int idx;
  double val;
  LPRowBase<double> empty;
  
  iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar3 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  empty.left._0_4_ = 0;
  idx = iVar2;
  LPColSetBase<double>::add
            (&this->super_LPColSetBase<double>,objValue,lowerValue,colVec,upperValue,(int *)&empty);
  if (this->thesense != MAXIMIZE) {
    pdVar4 = (this->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4[iVar2] = -pdVar4[iVar2];
  }
  if (scale) {
    local_88 = (*this->lp_scaler->_vptr_SPxScaler[1])
                         (this->lp_scaler,colVec,&(this->super_LPRowSetBase<double>).scaleExp);
    dVar10 = (this->super_LPColSetBase<double>).up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar2];
    pdVar7 = (double *)infinity();
    if (dVar10 < *pdVar7) {
      dVar10 = ldexp((this->super_LPColSetBase<double>).up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2],-local_88);
      (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar2] = dVar10;
    }
    dVar10 = (this->super_LPColSetBase<double>).low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar2];
    pdVar7 = (double *)infinity();
    if (-*pdVar7 < dVar10) {
      dVar10 = ldexp((this->super_LPColSetBase<double>).low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2],-local_88);
      (this->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar2] = dVar10;
    }
    dVar10 = ldexp((this->super_LPColSetBase<double>).object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2],local_88);
    (this->super_LPColSetBase<double>).object.val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [iVar2] = dVar10;
    (this->super_LPColSetBase<double>).scaleExp.data[iVar2] = local_88;
  }
  else {
    local_88 = 0;
  }
  pIVar5 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx;
  pIVar1 = pIVar5 + iVar2;
  uVar8 = (ulong)(uint)pIVar5[iVar2].data.super_SVectorBase<double>.memused;
  while (0 < (int)uVar8) {
    uVar8 = uVar8 - 1;
    pNVar6 = (pIVar1->data).super_SVectorBase<double>.m_elem;
    iVar2 = pNVar6[uVar8].idx;
    dVar10 = pNVar6[uVar8].val;
    if (scale) {
      dVar10 = ldexp(dVar10,(this->super_LPRowSetBase<double>).scaleExp.data[iVar2] + local_88);
      (pIVar1->data).super_SVectorBase<double>.m_elem[uVar8].val = dVar10;
    }
    val = dVar10;
    if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar2) {
      LPRowBase<double>::LPRowBase(&empty,0);
      for (iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
          iVar9 <= iVar2; iVar9 = iVar9 + 1) {
        LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,&empty);
      }
      DSVectorBase<double>::~DSVectorBase(&empty.vec);
    }
    LPRowSetBase<double>::add2(&this->super_LPRowSetBase<double>,iVar2,1,&idx,&val);
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])(this,1);
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                thenum - iVar3));
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }